

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

MD5_context * Curl_MD5_init(MD5_params *md5params)

{
  Curl_MD5_update_func p_Var1;
  MD5_context *ctxt;
  MD5_params *md5params_local;
  
  md5params_local = (MD5_params *)(*Curl_cmalloc)(0x10);
  if (md5params_local != (MD5_params *)0x0) {
    p_Var1 = (Curl_MD5_update_func)(*Curl_cmalloc)((size_t)md5params->md5_ctxtsize);
    md5params_local->md5_update_func = p_Var1;
    if (md5params_local->md5_update_func == (Curl_MD5_update_func)0x0) {
      (*Curl_cfree)(md5params_local);
      md5params_local = (MD5_params *)0x0;
    }
    else {
      md5params_local->md5_init_func = (Curl_MD5_init_func)md5params;
      (*md5params->md5_init_func)(md5params_local->md5_update_func);
    }
  }
  return (MD5_context *)md5params_local;
}

Assistant:

MD5_context *Curl_MD5_init(const MD5_params *md5params)
{
  MD5_context *ctxt;

  /* Create MD5 context */
  ctxt = malloc(sizeof *ctxt);

  if(!ctxt)
    return ctxt;

  ctxt->md5_hashctx = malloc(md5params->md5_ctxtsize);

  if(!ctxt->md5_hashctx) {
    free(ctxt);
    return NULL;
  }

  ctxt->md5_hash = md5params;

  (*md5params->md5_init_func)(ctxt->md5_hashctx);

  return ctxt;
}